

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

uintptr_t ngx_escape_html(u_char *dst,u_char *src,size_t size)

{
  u_char *local_38;
  ngx_uint_t len;
  size_t sStack_28;
  u_char ch;
  size_t size_local;
  u_char *src_local;
  u_char *dst_local;
  
  sStack_28 = size;
  size_local = (size_t)src;
  src_local = dst;
  if (dst == (u_char *)0x0) {
    local_38 = (u_char *)0x0;
    size_local = (size_t)src;
    for (; sStack_28 != 0; sStack_28 = sStack_28 - 1) {
      switch(*(undefined1 *)size_local) {
      case 0x22:
        local_38 = local_38 + 5;
        break;
      default:
        break;
      case 0x26:
        local_38 = local_38 + 4;
        break;
      case 0x3c:
        local_38 = local_38 + 3;
        break;
      case 0x3e:
        local_38 = local_38 + 3;
      }
      size_local = size_local + 1;
    }
    dst_local = local_38;
  }
  else {
    for (; sStack_28 != 0; sStack_28 = sStack_28 - 1) {
      switch(*(u_char *)size_local) {
      case '\"':
        builtin_memcpy(src_local,"&quot;",6);
        src_local = src_local + 6;
        break;
      default:
        *src_local = *(u_char *)size_local;
        src_local = src_local + 1;
        break;
      case '&':
        builtin_memcpy(src_local,"&amp;",5);
        src_local = src_local + 5;
        break;
      case '<':
        builtin_memcpy(src_local,"&lt;",4);
        src_local = src_local + 4;
        break;
      case '>':
        builtin_memcpy(src_local,"&gt;",4);
        src_local = src_local + 4;
      }
      size_local = size_local + 1;
    }
    dst_local = src_local;
  }
  return (uintptr_t)dst_local;
}

Assistant:

uintptr_t
ngx_escape_html(u_char *dst, u_char *src, size_t size)
{
    u_char      ch;
    ngx_uint_t  len;

    if (dst == NULL) {

        len = 0;

        while (size) {
            switch (*src++) {

            case '<':
                len += sizeof("&lt;") - 2;
                break;

            case '>':
                len += sizeof("&gt;") - 2;
                break;

            case '&':
                len += sizeof("&amp;") - 2;
                break;

            case '"':
                len += sizeof("&quot;") - 2;
                break;

            default:
                break;
            }
            size--;
        }

        return (uintptr_t) len;
    }

    while (size) {
        ch = *src++;

        switch (ch) {

        case '<':
            *dst++ = '&'; *dst++ = 'l'; *dst++ = 't'; *dst++ = ';';
            break;

        case '>':
            *dst++ = '&'; *dst++ = 'g'; *dst++ = 't'; *dst++ = ';';
            break;

        case '&':
            *dst++ = '&'; *dst++ = 'a'; *dst++ = 'm'; *dst++ = 'p';
            *dst++ = ';';
            break;

        case '"':
            *dst++ = '&'; *dst++ = 'q'; *dst++ = 'u'; *dst++ = 'o';
            *dst++ = 't'; *dst++ = ';';
            break;

        default:
            *dst++ = ch;
            break;
        }
        size--;
    }

    return (uintptr_t) dst;
}